

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcManager.h
# Opt level: O0

void __thiscall GrcManager::SetCompilerVersionFor(GrcManager *this,int fxdSilfVersion)

{
  int fxdSilfVersion_local;
  GrcManager *this_local;
  
  if (fxdSilfVersion == 0x10000) {
    this->m_fxdCompilerVersion = 0x10000;
  }
  else if (fxdSilfVersion == 0x20000) {
    this->m_fxdCompilerVersion = 0x20000;
  }
  else if (fxdSilfVersion == 0x20001) {
    this->m_fxdCompilerVersion = 0x40001;
  }
  else if (fxdSilfVersion == 0x30000) {
    this->m_fxdCompilerVersion = 0x30000;
  }
  else if (fxdSilfVersion == 0x30001) {
    this->m_fxdCompilerVersion = 0x40000;
  }
  else if (fxdSilfVersion == 0x30002) {
    this->m_fxdCompilerVersion = 0x40001;
  }
  else if (fxdSilfVersion == 0x40000) {
    this->m_fxdCompilerVersion = 0x40002;
  }
  else if (fxdSilfVersion == 0x40001) {
    this->m_fxdCompilerVersion = 0x50000;
  }
  else if (fxdSilfVersion == 0x50000) {
    this->m_fxdCompilerVersion = 0x50000;
  }
  else {
    this->m_fxdCompilerVersion = 0xff0000;
  }
  return;
}

Assistant:

void SetCompilerVersionFor(int fxdSilfVersion)
	{
		switch (fxdSilfVersion)
		{
		case 0x00010000:	m_fxdCompilerVersion = 0x00010000;		break;
		case 0x00020000:	m_fxdCompilerVersion = 0x00020000;		break;
		case 0x00020001:	m_fxdCompilerVersion = 0x00040001;		break;
		case 0x00030000:	m_fxdCompilerVersion = 0x00030000;		break;
		case 0x00030001:	m_fxdCompilerVersion = 0x00040000;		break;
		case 0x00030002:	m_fxdCompilerVersion = 0x00040001;		break;
		case 0x00040000:	m_fxdCompilerVersion = 0x00040002;		break;
		case 0x00040001:	m_fxdCompilerVersion = 0x00050000;		break;
		case 0x00050000:	m_fxdCompilerVersion = 0x00050000;		break;
		default:			m_fxdCompilerVersion = 0x00FF0000;		break;	// unknown
		}
	}